

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosComm.cpp
# Opt level: O1

int __thiscall adios2::helper::Comm::Win::Free(Win *this,string *hint)

{
  _Head_base<0UL,_adios2::helper::CommWinImpl_*,_false> _Var1;
  int iVar2;
  
  _Var1._M_head_impl =
       (this->m_Impl)._M_t.
       super___uniq_ptr_impl<adios2::helper::CommWinImpl,_std::default_delete<adios2::helper::CommWinImpl>_>
       ._M_t.
       super__Tuple_impl<0UL,_adios2::helper::CommWinImpl_*,_std::default_delete<adios2::helper::CommWinImpl>_>
       .super__Head_base<0UL,_adios2::helper::CommWinImpl_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (CommWinImpl *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = (*(_Var1._M_head_impl)->_vptr_CommWinImpl[2])();
    _Var1._M_head_impl =
         (this->m_Impl)._M_t.
         super___uniq_ptr_impl<adios2::helper::CommWinImpl,_std::default_delete<adios2::helper::CommWinImpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_adios2::helper::CommWinImpl_*,_std::default_delete<adios2::helper::CommWinImpl>_>
         .super__Head_base<0UL,_adios2::helper::CommWinImpl_*,_false>._M_head_impl;
    (this->m_Impl)._M_t.
    super___uniq_ptr_impl<adios2::helper::CommWinImpl,_std::default_delete<adios2::helper::CommWinImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_adios2::helper::CommWinImpl_*,_std::default_delete<adios2::helper::CommWinImpl>_>
    .super__Head_base<0UL,_adios2::helper::CommWinImpl_*,_false>._M_head_impl = (CommWinImpl *)0x0;
    if (_Var1._M_head_impl != (CommWinImpl *)0x0) {
      (*(_Var1._M_head_impl)->_vptr_CommWinImpl[1])();
    }
  }
  return iVar2;
}

Assistant:

int Comm::Win::Free(const std::string &hint)
{
    int status = 0;
    if (m_Impl)
    {
        status = m_Impl->Free(hint);
        m_Impl.reset();
    }
    return status;
}